

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

int Dau_CountSymms(word t,int nVars)

{
  int iVar1;
  int local_34;
  int local_30;
  int nPairs;
  int j;
  int i;
  word Cof1;
  word Cof0;
  word wStack_10;
  int nVars_local;
  word t_local;
  
  local_34 = 0;
  Cof0._4_4_ = nVars;
  wStack_10 = t;
  for (nPairs = 0; local_30 = nPairs, nPairs < Cof0._4_4_; nPairs = nPairs + 1) {
    while (local_30 = local_30 + 1, local_30 < Cof0._4_4_) {
      iVar1 = Abc_TtVarsAreSymmetric
                        (&stack0xfffffffffffffff0,Cof0._4_4_,nPairs,local_30,&Cof1,(word *)&j);
      local_34 = iVar1 + local_34;
    }
  }
  return local_34;
}

Assistant:

int Dau_CountSymms( word t, int nVars )
{
    word Cof0, Cof1;
    int i, j, nPairs = 0;
    for ( i = 0; i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
        nPairs += Abc_TtVarsAreSymmetric(&t, nVars, i, j, &Cof0, &Cof1);
    return nPairs;
}